

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

SourceContextInfo * __thiscall
Js::ScriptContext::CreateSourceContextInfo
          (ScriptContext *this,uint hash,DWORD_PTR hostSourceContext)

{
  ThreadContext *this_00;
  int iVar1;
  uint uVar2;
  SourceContextInfo *pSVar3;
  Cache *pCVar4;
  SourceContextInfo **ppSVar5;
  BaseDictionary<unsigned_int,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar6;
  Recycler *pRVar7;
  ScriptContext *this_01;
  char16 *url;
  SourceDynamicProfileManager *ptr;
  TrackAllocData local_58;
  ScriptContext *local_30;
  SourceContextInfo *sourceContextInfo;
  DWORD_PTR hostSourceContext_local;
  ScriptContext *pSStack_18;
  uint hash_local;
  ScriptContext *this_local;
  
  sourceContextInfo = (SourceContextInfo *)hostSourceContext;
  hostSourceContext_local._4_4_ = hash;
  pSStack_18 = this;
  EnsureDynamicSourceContextInfoMap(this);
  pSVar3 = GetSourceContextInfo(this,hostSourceContext_local._4_4_);
  if (pSVar3 == (SourceContextInfo *)0x0) {
    pCVar4 = Cache(this);
    pBVar6 = Memory::
             WriteBarrierPtr<JsUtil::BaseDictionary<unsigned_int,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
             ::operator->(&pCVar4->dynamicSourceContextInfoMap);
    iVar1 = JsUtil::
            BaseDictionary<unsigned_int,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::Count(pBVar6);
    if (iVar1 < 0x33) {
      pRVar7 = GetRecycler(this);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_58,(type_info *)&SourceContextInfo::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                 ,0xbc9);
      pRVar7 = Memory::Recycler::TrackAllocInfo(pRVar7,&local_58);
      this_01 = (ScriptContext *)new<Memory::Recycler>(0x38,pRVar7,0x744a10);
      SourceContextInfo::SourceContextInfo((SourceContextInfo *)this_01);
      local_30 = this_01;
      uVar2 = GetNextSourceContextId(this);
      *(uint *)&(local_30->super_ScriptContextInfo)._vptr_ScriptContextInfo = uVar2;
      (local_30->super_ScriptContextBase).globalObject = (GlobalObject *)sourceContextInfo;
      (local_30->super_ScriptContextBase).isClosed = true;
      ((anon_union_16_2_4721f384_for_SourceContextInfo_5 *)
      &(local_30->super_ScriptContextBase).pActiveScriptDirect)->hash =
           hostSourceContext_local._4_4_;
      this_00 = this->threadContext;
      url = GetUrl(this);
      ptr = ThreadContext::GetSourceDynamicProfileManager
                      (this_00,url,hostSourceContext_local._4_4_,
                       &this->referencesSharedDynamicSourceContextInfo);
      Memory::WriteBarrierPtr<Js::SourceDynamicProfileManager>::operator=
                ((Type *)&local_30->next,ptr);
      if (sourceContextInfo == (SourceContextInfo *)&DAT_ffffffffffffffff) {
        pCVar4 = Cache(this);
        pBVar6 = Memory::
                 WriteBarrierPtr<JsUtil::BaseDictionary<unsigned_int,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                 ::operator->(&pCVar4->dynamicSourceContextInfoMap);
        JsUtil::
        BaseDictionary<unsigned_int,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        ::Add(pBVar6,(uint *)((long)&hostSourceContext_local + 4),(SourceContextInfo **)&local_30);
      }
      this_local = local_30;
    }
    else {
      Output::Trace(DynamicProfilePhase,L"Max of dynamic script profile info reached.\n");
      pCVar4 = Cache(this);
      ppSVar5 = Memory::WriteBarrierPtr::operator_cast_to_SourceContextInfo__
                          ((WriteBarrierPtr *)&pCVar4->noContextSourceContextInfo);
      this_local = (ScriptContext *)*ppSVar5;
    }
  }
  else {
    pCVar4 = Cache(this);
    ppSVar5 = Memory::WriteBarrierPtr::operator_cast_to_SourceContextInfo__
                        ((WriteBarrierPtr *)&pCVar4->noContextSourceContextInfo);
    this_local = (ScriptContext *)*ppSVar5;
  }
  return (SourceContextInfo *)this_local;
}

Assistant:

SourceContextInfo* ScriptContext::CreateSourceContextInfo(uint hash, DWORD_PTR hostSourceContext)
    {
        EnsureDynamicSourceContextInfoMap();
        if (this->GetSourceContextInfo(hash) != nullptr)
        {
            return this->Cache()->noContextSourceContextInfo;
        }

        if (this->Cache()->dynamicSourceContextInfoMap->Count() > INMEMORY_CACHE_MAX_PROFILE_MANAGER)
        {
            OUTPUT_TRACE(Js::DynamicProfilePhase, _u("Max of dynamic script profile info reached.\n"));
            return this->Cache()->noContextSourceContextInfo;
        }

        // This is capped so we can continue allocating in the arena
        SourceContextInfo * sourceContextInfo = RecyclerNewStructZ(this->GetRecycler(), SourceContextInfo);
        sourceContextInfo->sourceContextId = this->GetNextSourceContextId();
        sourceContextInfo->dwHostSourceContext = hostSourceContext;
        sourceContextInfo->isHostDynamicDocument = true;
        sourceContextInfo->hash = hash;
#if ENABLE_PROFILE_INFO
        sourceContextInfo->sourceDynamicProfileManager = this->threadContext->GetSourceDynamicProfileManager(this->GetUrl(), hash, &referencesSharedDynamicSourceContextInfo);
#endif

        // For the host provided dynamic code (if hostSourceContext is not NoHostSourceContext), do not add to dynamicSourceContextInfoMap
        if (hostSourceContext == Js::Constants::NoHostSourceContext)
        {
            this->Cache()->dynamicSourceContextInfoMap->Add(hash, sourceContextInfo);
        }
        return sourceContextInfo;
    }